

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVector.cpp
# Opt level: O0

bool __thiscall celero::TestVector::containsGroup(TestVector *this,string *x)

{
  bool bVar1;
  Impl *pIVar2;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  local_70;
  anon_class_32_1_54a39818_for__M_pred local_68;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  local_48;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  local_28;
  __normal_iterator<const_std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  found;
  lock_guard<std::mutex> mutexLock;
  string *x_local;
  TestVector *this_local;
  
  pIVar2 = Pimpl<celero::TestVector::Impl>::operator->(&this->pimpl);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&found,&pIVar2->testVectorMutex)
  ;
  pIVar2 = Pimpl<celero::TestVector::Impl>::operator->(&this->pimpl);
  local_30._M_current =
       (shared_ptr<celero::Benchmark> *)
       std::
       begin<std::vector<std::shared_ptr<celero::Benchmark>,std::allocator<std::shared_ptr<celero::Benchmark>>>>
                 (&pIVar2->testVector);
  pIVar2 = Pimpl<celero::TestVector::Impl>::operator->(&this->pimpl);
  local_48._M_current =
       (shared_ptr<celero::Benchmark> *)
       std::
       end<std::vector<std::shared_ptr<celero::Benchmark>,std::allocator<std::shared_ptr<celero::Benchmark>>>>
                 (&pIVar2->testVector);
  std::__cxx11::string::string((string *)&local_68,(string *)x);
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<celero::Benchmark>const*,std::vector<std::shared_ptr<celero::Benchmark>,std::allocator<std::shared_ptr<celero::Benchmark>>>>,celero::TestVector::containsGroup(std::__cxx11::string_const&)const::__0>
                       (local_30,local_48,&local_68);
  containsGroup(std::__cxx11::string_const&)::~__0
            ((containsGroup_std____cxx11__string_const__ *)&local_68);
  pIVar2 = Pimpl<celero::TestVector::Impl>::operator->(&this->pimpl);
  local_70._M_current =
       (shared_ptr<celero::Benchmark> *)
       std::
       end<std::vector<std::shared_ptr<celero::Benchmark>,std::allocator<std::shared_ptr<celero::Benchmark>>>>
                 (&pIVar2->testVector);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_70);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&found);
  return bVar1;
}

Assistant:

bool TestVector::containsGroup(const std::string& x) const
{
	std::lock_guard<std::mutex> mutexLock(this->pimpl->testVectorMutex);

	const auto found = std::find_if(std::begin(this->pimpl->testVector), std::end(this->pimpl->testVector),
									[x](std::shared_ptr<Benchmark> const& bmark) -> bool { return (bmark->getName() == x); });

	return found != std::end(this->pimpl->testVector);
}